

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall
QFileSystemModelPrivate::addVisibleFiles
          (QFileSystemModelPrivate *this,QFileSystemNode *parentNode,QStringList *newFiles)

{
  bool bVar1;
  bool bVar2;
  QModelIndex *pQVar3;
  qsizetype qVar4;
  const_iterator o;
  QFileSystemNode *pQVar5;
  QList<QString> *in_RDX;
  long in_RSI;
  QFileSystemModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *newFile;
  QStringList *__range1;
  bool indexHidden;
  QFileSystemModel *q;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndex parent;
  parameter_type in_stack_ffffffffffffff68;
  QModelIndex *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QFileSystemModelPrivate *in_stack_ffffffffffffff80;
  const_iterator local_28;
  undefined1 local_20 [16];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QModelIndex *)q_func(in_RDI);
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  index((QFileSystemModelPrivate *)local_20,(char *)in_RDI,(int)in_RSI);
  bVar1 = isHiddenByFilter(in_stack_ffffffffffffff80,
                           (QFileSystemNode *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           in_stack_ffffffffffffff70);
  if (!bVar1) {
    qVar4 = QList<QString>::size((QList<QString> *)(in_RSI + 0x20));
    in_stack_ffffffffffffff7c = (int)qVar4;
    QList<QString>::size((QList<QString> *)(in_RSI + 0x20));
    QList<QString>::size(in_RDX);
    QAbstractItemModel::beginInsertRows
              ((QModelIndex *)pQVar3,(int)local_20,in_stack_ffffffffffffff7c);
    in_stack_ffffffffffffff70 = pQVar3;
  }
  if (*(int *)(in_RSI + 0x48) == -1) {
    qVar4 = QList<QString>::size((QList<QString> *)(in_RSI + 0x20));
    *(int *)(in_RSI + 0x48) = (int)qVar4;
  }
  local_28.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QString>::begin((QList<QString> *)in_stack_ffffffffffffff70);
  o = QList<QString>::end((QList<QString> *)in_stack_ffffffffffffff70);
  while( true ) {
    bVar2 = QList<QString>::const_iterator::operator!=(&local_28,o);
    if (!bVar2) break;
    QList<QString>::const_iterator::operator*(&local_28);
    QList<QString>::append((QList<QString> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pQVar5 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                       ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (QString *)in_stack_ffffffffffffff70);
    pQVar5->isVisible = true;
    QList<QString>::const_iterator::operator++(&local_28);
  }
  if (!bVar1) {
    QAbstractItemModel::endInsertRows();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::addVisibleFiles(QFileSystemNode *parentNode, const QStringList &newFiles)
{
    Q_Q(QFileSystemModel);
    QModelIndex parent = index(parentNode);
    bool indexHidden = isHiddenByFilter(parentNode, parent);
    if (!indexHidden) {
        q->beginInsertRows(parent, parentNode->visibleChildren.size() , parentNode->visibleChildren.size() + newFiles.size() - 1);
    }

    if (parentNode->dirtyChildrenIndex == -1)
        parentNode->dirtyChildrenIndex = parentNode->visibleChildren.size();

    for (const auto &newFile : newFiles) {
        parentNode->visibleChildren.append(newFile);
        parentNode->children.value(newFile)->isVisible = true;
    }
    if (!indexHidden)
      q->endInsertRows();
}